

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O0

bool __thiscall
draco::AttributeQuantizationTransform::DecodeParameters
          (AttributeQuantizationTransform *this,PointAttribute *attribute,
          DecoderBuffer *decoder_buffer)

{
  bool bVar1;
  DecoderBuffer *in_RDX;
  GeometryAttribute *in_RSI;
  float *in_RDI;
  uint8_t quantization_bits;
  float *size_to_decode;
  undefined7 in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffdf;
  bool local_1;
  
  size_to_decode = in_RDI + 4;
  GeometryAttribute::num_components(in_RSI);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)in_RDX,
             CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)(in_RDI + 4),0);
  std::vector<float,_std::allocator<float>_>::size
            ((vector<float,_std::allocator<float>_> *)(in_RDI + 4));
  bVar1 = DecoderBuffer::Decode(in_RDX,in_RDI,(size_t)size_to_decode);
  if (bVar1) {
    bVar1 = DecoderBuffer::Decode<float>(in_RDX,in_RDI);
    if (bVar1) {
      bVar1 = DecoderBuffer::Decode<unsigned_char>(in_RDX,(uchar *)in_RDI);
      if (bVar1) {
        bVar1 = IsQuantizationValid((uint)in_stack_ffffffffffffffdf);
        if (bVar1) {
          in_RDI[2] = (float)(uint)in_stack_ffffffffffffffdf;
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AttributeQuantizationTransform::DecodeParameters(
    const PointAttribute &attribute, DecoderBuffer *decoder_buffer) {
  min_values_.resize(attribute.num_components());
  if (!decoder_buffer->Decode(&min_values_[0],
                              sizeof(float) * min_values_.size())) {
    return false;
  }
  if (!decoder_buffer->Decode(&range_)) {
    return false;
  }
  uint8_t quantization_bits;
  if (!decoder_buffer->Decode(&quantization_bits)) {
    return false;
  }
  if (!IsQuantizationValid(quantization_bits)) {
    return false;
  }
  quantization_bits_ = quantization_bits;
  return true;
}